

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.hxx
# Opt level: O3

void __thiscall nuraft::stat_elem::reset(stat_elem *this)

{
  Histogram *pHVar1;
  size_t i;
  long lVar2;
  Histogram empty_histogram;
  Histogram local_48;
  
  if (this->stat_type_ == HISTOGRAM) {
    Histogram::Histogram(&local_48,2.0);
    pHVar1 = this->hist_;
    pHVar1->EXP_BASE = local_48.EXP_BASE;
    pHVar1->EXP_BASE_LOG = local_48.EXP_BASE_LOG;
    LOCK();
    (pHVar1->count).super___atomic_base<unsigned_long>._M_i =
         (__int_type)local_48.count.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (pHVar1->sum).super___atomic_base<unsigned_long>._M_i =
         (__int_type)local_48.sum.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (pHVar1->max).super___atomic_base<unsigned_long>._M_i =
         (__int_type)local_48.max.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    lVar2 = 0;
    do {
      LOCK();
      pHVar1->bins[lVar2].super___atomic_base<unsigned_long>._M_i =
           local_48.bins[lVar2].super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x41);
    if (local_48.bins != (HistBin *)0x0) {
      operator_delete__(local_48.bins);
    }
  }
  return;
}

Assistant:

void reset() {
        switch (stat_type_) {
        case COUNTER:
        case GAUGE:
            set(0);
            break;
        case HISTOGRAM: {
            Histogram empty_histogram;
            *hist_ = empty_histogram;
            break; }
        default: break;
        }
    }